

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

Curl_dns_entry * Curl_fetch_addr(connectdata *conn,char *hostname,int port,int *stale)

{
  SessionHandle *pSVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  Curl_dns_entry *pCVar4;
  Curl_dns_entry *c;
  long local_30;
  long local_28;
  
  pSVar1 = conn->data;
  __s = create_hostcache_id(hostname,port);
  if (__s == (char *)0x0) {
    return (Curl_dns_entry *)0x0;
  }
  sVar3 = strlen(__s);
  pCVar4 = (Curl_dns_entry *)Curl_hash_pick((pSVar1->dns).hostcache,__s,sVar3 + 1);
  (*Curl_cfree)(__s);
  if ((((pCVar4 != (Curl_dns_entry *)0x0) && ((pSVar1->set).dns_cache_timeout != -1)) &&
      ((pSVar1->dns).hostcache != (curl_hash *)0x0)) && (pCVar4->inuse == 0)) {
    time(&local_28);
    local_30 = (pSVar1->set).dns_cache_timeout;
    if ((pCVar4->inuse == 0) && (local_30 <= local_28 - pCVar4->timestamp)) {
      Curl_hash_clean_with_criterium((pSVar1->dns).hostcache,&local_30,hostcache_timestamp_remove);
      iVar2 = 1;
      pCVar4 = (Curl_dns_entry *)0x0;
      goto LAB_0046246a;
    }
  }
  iVar2 = 0;
LAB_0046246a:
  *stale = iVar2;
  return pCVar4;
}

Assistant:

struct Curl_dns_entry *
Curl_fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port, int *stale)
{
  char *entry_id = NULL;
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct SessionHandle *data = conn->data;

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return dns;

  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

  /* free the allocated entry_id again */
  free(entry_id);

  /* See whether the returned entry is stale. Done before we release lock */
  *stale = remove_entry_if_stale(data, dns);
  if(*stale)
    dns = NULL; /* the memory deallocation is being handled by the hash */

  return dns;
}